

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in1_14;
  __m256i in1_15;
  __m256i in1_16;
  __m256i in1_17;
  __m256i in1_18;
  __m256i in1_19;
  __m256i in1_20;
  __m256i in1_21;
  __m256i in1_22;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  __m256i in0_14;
  __m256i in0_15;
  __m256i in0_16;
  __m256i in0_17;
  __m256i in0_18;
  __m256i in0_19;
  __m256i in0_20;
  __m256i in0_21;
  __m256i in0_22;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint size;
  uint uVar37;
  uint uVar38;
  int iVar39;
  int32_t *piVar40;
  int in_ECX;
  uint uVar41;
  uint uVar42;
  uint in_EDX;
  undefined8 *in_RDI;
  int in_R8D;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i y;
  __m256i x;
  __m256i v [16];
  __m256i u [16];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  __m256i cospim48;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospi48;
  __m256i cospi32;
  __m256i cospi8;
  __m256i cospi40;
  __m256i cospim40;
  __m256i cospi24;
  __m256i cospim8;
  __m256i cospi56;
  __m256i cospi4;
  __m256i cospi36;
  __m256i cospi52;
  __m256i cospim52;
  __m256i cospi12;
  __m256i cospim20;
  __m256i cospi20;
  __m256i cospi44;
  __m256i cospim36;
  __m256i cospi28;
  __m256i cospim4;
  __m256i cospi60;
  int32_t *cospi;
  int in_stack_ffffffffffffe7a4;
  char local_1850;
  char local_1844;
  uint uVar45;
  uint bit_00;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  undefined8 in_stack_ffffffffffffe820;
  undefined8 in_stack_ffffffffffffe828;
  longlong in_stack_ffffffffffffe830;
  char local_fc4;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  __m256i *palStack_170;
  
  piVar40 = cospi_arr(in_EDX);
  uVar32 = piVar40[0x3c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  uVar32 = -piVar40[4];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  uVar32 = piVar40[0x1c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  uVar32 = -piVar40[0x24];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  uVar32 = piVar40[0x2c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  uVar32 = piVar40[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  uVar33 = -piVar40[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(uVar33),uVar33,1);
  auVar1 = vpinsrd_avx(auVar1,uVar33,2);
  vpinsrd_avx(auVar1,uVar33,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar33),uVar33,1);
  auVar1 = vpinsrd_avx(auVar1,uVar33,2);
  vpinsrd_avx(auVar1,uVar33,3);
  uVar32 = piVar40[0xc];
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
  auVar1 = vpinsrd_avx(auVar1,uVar32,2);
  vpinsrd_avx(auVar1,uVar32,3);
  uVar34 = -piVar40[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
  auVar1 = vpinsrd_avx(auVar1,uVar34,2);
  vpinsrd_avx(auVar1,uVar34,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
  auVar1 = vpinsrd_avx(auVar1,uVar34,2);
  vpinsrd_avx(auVar1,uVar34,3);
  uVar42 = piVar40[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(uVar42),uVar42,1);
  auVar1 = vpinsrd_avx(auVar1,uVar42,2);
  vpinsrd_avx(auVar1,uVar42,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar42),uVar42,1);
  auVar1 = vpinsrd_avx(auVar1,uVar42,2);
  vpinsrd_avx(auVar1,uVar42,3);
  uVar45 = piVar40[0x24];
  auVar1 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
  auVar1 = vpinsrd_avx(auVar1,uVar45,2);
  vpinsrd_avx(auVar1,uVar45,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar45),uVar45,1);
  auVar1 = vpinsrd_avx(auVar1,uVar45,2);
  vpinsrd_avx(auVar1,uVar45,3);
  bit_00 = piVar40[4];
  auVar1 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar1 = vpinsrd_avx(auVar1,bit_00,2);
  vpinsrd_avx(auVar1,bit_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar1 = vpinsrd_avx(auVar1,bit_00,2);
  vpinsrd_avx(auVar1,bit_00,3);
  uVar46 = piVar40[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(uVar46),uVar46,1);
  auVar1 = vpinsrd_avx(auVar1,uVar46,2);
  vpinsrd_avx(auVar1,uVar46,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar46),uVar46,1);
  auVar1 = vpinsrd_avx(auVar1,uVar46,2);
  vpinsrd_avx(auVar1,uVar46,3);
  uVar35 = -piVar40[8];
  auVar1 = vpinsrd_avx(ZEXT416(uVar35),uVar35,1);
  auVar1 = vpinsrd_avx(auVar1,uVar35,2);
  vpinsrd_avx(auVar1,uVar35,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar35),uVar35,1);
  auVar1 = vpinsrd_avx(auVar1,uVar35,2);
  vpinsrd_avx(auVar1,uVar35,3);
  uVar47 = piVar40[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(uVar47),uVar47,1);
  auVar1 = vpinsrd_avx(auVar1,uVar47,2);
  vpinsrd_avx(auVar1,uVar47,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar47),uVar47,1);
  auVar1 = vpinsrd_avx(auVar1,uVar47,2);
  vpinsrd_avx(auVar1,uVar47,3);
  uVar36 = -piVar40[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar1 = vpinsrd_avx(auVar1,uVar36,2);
  vpinsrd_avx(auVar1,uVar36,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar36),uVar36,1);
  auVar1 = vpinsrd_avx(auVar1,uVar36,2);
  vpinsrd_avx(auVar1,uVar36,3);
  uVar48 = piVar40[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(uVar48),uVar48,1);
  auVar1 = vpinsrd_avx(auVar1,uVar48,2);
  vpinsrd_avx(auVar1,uVar48,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar48),uVar48,1);
  auVar1 = vpinsrd_avx(auVar1,uVar48,2);
  vpinsrd_avx(auVar1,uVar48,3);
  uVar49 = piVar40[8];
  auVar1 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar1 = vpinsrd_avx(auVar1,uVar49,2);
  vpinsrd_avx(auVar1,uVar49,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar1 = vpinsrd_avx(auVar1,uVar49,2);
  vpinsrd_avx(auVar1,uVar49,3);
  uVar50 = piVar40[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar1 = vpinsrd_avx(auVar1,uVar50,2);
  auVar1 = vpinsrd_avx(auVar1,uVar50,3);
  auVar44 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar44 = vpinsrd_avx(auVar44,uVar50,2);
  auVar44 = vpinsrd_avx(auVar44,uVar50,3);
  uStack_3b0 = auVar44._0_8_;
  uStack_3a8 = auVar44._8_8_;
  uVar51 = piVar40[0x30];
  auVar44 = vpinsrd_avx(ZEXT416(uVar51),uVar51,1);
  auVar44 = vpinsrd_avx(auVar44,uVar51,2);
  vpinsrd_avx(auVar44,uVar51,3);
  auVar44 = vpinsrd_avx(ZEXT416(uVar51),uVar51,1);
  auVar44 = vpinsrd_avx(auVar44,uVar51,2);
  vpinsrd_avx(auVar44,uVar51,3);
  uVar52 = piVar40[0x10];
  auVar44 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar44 = vpinsrd_avx(auVar44,uVar52,2);
  vpinsrd_avx(auVar44,uVar52,3);
  auVar44 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar44 = vpinsrd_avx(auVar44,uVar52,2);
  vpinsrd_avx(auVar44,uVar52,3);
  size = -piVar40[0x10];
  auVar44 = vpinsrd_avx(ZEXT416(size),size,1);
  auVar44 = vpinsrd_avx(auVar44,size,2);
  vpinsrd_avx(auVar44,size,3);
  auVar44 = vpinsrd_avx(ZEXT416(size),size,1);
  auVar44 = vpinsrd_avx(auVar44,size,2);
  vpinsrd_avx(auVar44,size,3);
  uVar37 = -piVar40[0x30];
  auVar44 = vpinsrd_avx(ZEXT416(uVar37),uVar37,1);
  auVar44 = vpinsrd_avx(auVar44,uVar37,2);
  vpinsrd_avx(auVar44,uVar37,3);
  auVar44 = vpinsrd_avx(ZEXT416(uVar37),uVar37,1);
  auVar44 = vpinsrd_avx(auVar44,uVar37,2);
  vpinsrd_avx(auVar44,uVar37,3);
  local_fc4 = (char)in_EDX;
  uVar38 = 1 << (local_fc4 - 1U & 0x1f);
  auVar44 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar44 = vpinsrd_avx(auVar44,uVar38,2);
  auVar44 = vpinsrd_avx(auVar44,uVar38,3);
  auVar43 = vpinsrd_avx(ZEXT416(uVar38),uVar38,1);
  auVar43 = vpinsrd_avx(auVar43,uVar38,2);
  auVar43 = vpinsrd_avx(auVar43,uVar38,3);
  auVar43 = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar43;
  auVar44 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
  uStack_270 = auVar44._0_8_;
  uStack_268 = auVar44._8_8_;
  iVar39 = 8;
  if (in_ECX != 0) {
    iVar39 = 6;
  }
  if (in_R8D + iVar39 < 0x10) {
    local_1844 = '\x10';
  }
  else {
    local_1844 = '\b';
    if (in_ECX != 0) {
      local_1844 = '\x06';
    }
    local_1844 = (char)in_R8D + local_1844;
  }
  uVar41 = -(1 << (local_1844 - 1U & 0x1f));
  auVar44 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
  auVar44 = vpinsrd_avx(auVar44,uVar41,2);
  vpinsrd_avx(auVar44,uVar41,3);
  auVar44 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
  auVar44 = vpinsrd_avx(auVar44,uVar41,2);
  vpinsrd_avx(auVar44,uVar41,3);
  uVar41 = (1 << (local_1844 - 1U & 0x1f)) - 1;
  auVar44 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
  auVar44 = vpinsrd_avx(auVar44,uVar41,2);
  vpinsrd_avx(auVar44,uVar41,3);
  auVar44 = vpinsrd_avx(ZEXT416(uVar41),uVar41,1);
  auVar44 = vpinsrd_avx(auVar44,uVar41,2);
  vpinsrd_avx(auVar44,uVar41,3);
  uVar5 = *in_RDI;
  uVar6 = in_RDI[3];
  uVar7 = in_RDI[0x20];
  uVar8 = in_RDI[0x23];
  uVar9 = in_RDI[0x28];
  uVar10 = in_RDI[0x2b];
  uVar11 = in_RDI[0x18];
  uVar12 = in_RDI[0x1b];
  auVar22 = *(undefined1 (*) [32])(in_RDI + 0x14);
  auVar30 = *(undefined1 (*) [32])(in_RDI + 0x34);
  auVar31 = *(undefined1 (*) [32])(in_RDI + 0xc);
  auVar23 = *(undefined1 (*) [32])(in_RDI + 0x2c);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  in0[0]._4_4_ = uVar38;
  in0[0]._0_4_ = uVar37;
  in0[1] = in_stack_ffffffffffffe820;
  in0[2] = in_stack_ffffffffffffe828;
  in0[3] = in_stack_ffffffffffffe830;
  in1[0]._4_4_ = uVar36;
  in1[0]._0_4_ = uVar47;
  in1[1]._0_4_ = uVar48;
  in1[1]._4_4_ = uVar49;
  in1[2]._0_4_ = uVar50;
  in1[2]._4_4_ = uVar51;
  in1[3]._0_4_ = uVar52;
  in1[3]._4_4_ = size;
  addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_00[0]._4_4_ = uVar38;
  in0_00[0]._0_4_ = uVar37;
  in0_00[1] = in_stack_ffffffffffffe820;
  in0_00[2] = in_stack_ffffffffffffe828;
  in0_00[3] = in_stack_ffffffffffffe830;
  in1_00[0]._4_4_ = uVar36;
  in1_00[0]._0_4_ = uVar47;
  in1_00[1]._0_4_ = uVar48;
  in1_00[1]._4_4_ = uVar49;
  in1_00[2]._0_4_ = uVar50;
  in1_00[2]._4_4_ = uVar51;
  in1_00[3]._0_4_ = uVar52;
  in1_00[3]._4_4_ = size;
  addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_01[0]._4_4_ = uVar38;
  in0_01[0]._0_4_ = uVar37;
  in0_01[1] = in_stack_ffffffffffffe820;
  in0_01[2] = in_stack_ffffffffffffe828;
  in0_01[3] = in_stack_ffffffffffffe830;
  in1_01[0]._4_4_ = uVar36;
  in1_01[0]._0_4_ = uVar47;
  in1_01[1]._0_4_ = uVar48;
  in1_01[1]._4_4_ = uVar49;
  in1_01[2]._0_4_ = uVar50;
  in1_01[2]._4_4_ = uVar51;
  in1_01[3]._0_4_ = uVar52;
  in1_01[3]._4_4_ = size;
  addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_02[0]._4_4_ = uVar38;
  in0_02[0]._0_4_ = uVar37;
  in0_02[1] = in_stack_ffffffffffffe820;
  in0_02[2] = in_stack_ffffffffffffe828;
  in0_02[3] = in_stack_ffffffffffffe830;
  in1_02[0]._4_4_ = uVar36;
  in1_02[0]._0_4_ = uVar47;
  in1_02[1]._0_4_ = uVar48;
  in1_02[1]._4_4_ = uVar49;
  in1_02[2]._0_4_ = uVar50;
  in1_02[2]._4_4_ = uVar51;
  in1_02[3]._0_4_ = uVar52;
  in1_02[3]._4_4_ = size;
  addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  auVar21._8_8_ = uVar5;
  auVar21._0_8_ = uVar5;
  auVar21._16_8_ = uVar5;
  auVar21._24_8_ = uVar6;
  auVar20._16_8_ = uStack_3b0;
  auVar20._0_16_ = auVar1;
  auVar20._24_8_ = uStack_3a8;
  auVar3 = vpmulld_avx2(auVar21,auVar20);
  auVar19._8_8_ = uVar7;
  auVar19._0_8_ = uVar7;
  auVar19._16_8_ = uVar7;
  auVar19._24_8_ = uVar8;
  auVar18._16_8_ = uStack_3b0;
  auVar18._0_16_ = auVar1;
  auVar18._24_8_ = uStack_3a8;
  auVar4 = vpmulld_avx2(auVar19,auVar18);
  auVar2 = vpaddd_avx2(auVar3,auVar4);
  auVar29._16_8_ = uStack_270;
  auVar29._0_16_ = auVar43;
  auVar29._24_8_ = uStack_268;
  auVar2 = vpaddd_avx2(auVar2,auVar29);
  vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  auVar2 = vpsubd_avx2(auVar3,auVar4);
  auVar28._16_8_ = uStack_270;
  auVar28._0_16_ = auVar43;
  auVar28._24_8_ = uStack_268;
  auVar2 = vpaddd_avx2(auVar2,auVar28);
  vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  in0_03[0]._4_4_ = uVar38;
  in0_03[0]._0_4_ = uVar37;
  in0_03[1] = in_stack_ffffffffffffe820;
  in0_03[2] = in_stack_ffffffffffffe828;
  in0_03[3] = in_stack_ffffffffffffe830;
  in1_03[0]._4_4_ = uVar36;
  in1_03[0]._0_4_ = uVar47;
  in1_03[1]._0_4_ = uVar48;
  in1_03[1]._4_4_ = uVar49;
  in1_03[2]._0_4_ = uVar50;
  in1_03[2]._4_4_ = uVar51;
  in1_03[3]._0_4_ = uVar52;
  in1_03[3]._4_4_ = size;
  addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_04[0]._4_4_ = uVar38;
  in0_04[0]._0_4_ = uVar37;
  in0_04[1] = in_stack_ffffffffffffe820;
  in0_04[2] = in_stack_ffffffffffffe828;
  in0_04[3] = in_stack_ffffffffffffe830;
  in1_04[0]._4_4_ = uVar36;
  in1_04[0]._0_4_ = uVar47;
  in1_04[1]._0_4_ = uVar48;
  in1_04[1]._4_4_ = uVar49;
  in1_04[2]._0_4_ = uVar50;
  in1_04[2]._4_4_ = uVar51;
  in1_04[3]._0_4_ = uVar52;
  in1_04[3]._4_4_ = size;
  addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar52),(__m256i *)CONCAT44(uVar51,uVar50),
                (__m256i *)CONCAT44(uVar49,uVar48),(__m256i *)CONCAT44(uVar36,uVar47),
                (__m256i *)CONCAT44(uVar35,uVar46),bit_00);
  in0_05[0]._4_4_ = uVar38;
  in0_05[0]._0_4_ = uVar37;
  in0_05[1] = in_stack_ffffffffffffe820;
  in0_05[2] = in_stack_ffffffffffffe828;
  in0_05[3] = in_stack_ffffffffffffe830;
  in1_05[0]._4_4_ = uVar36;
  in1_05[0]._0_4_ = uVar47;
  in1_05[1]._0_4_ = uVar48;
  in1_05[1]._4_4_ = uVar49;
  in1_05[2]._0_4_ = uVar50;
  in1_05[2]._4_4_ = uVar51;
  in1_05[3]._0_4_ = uVar52;
  in1_05[3]._4_4_ = size;
  addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_06[0]._4_4_ = uVar38;
  in0_06[0]._0_4_ = uVar37;
  in0_06[1] = in_stack_ffffffffffffe820;
  in0_06[2] = in_stack_ffffffffffffe828;
  in0_06[3] = in_stack_ffffffffffffe830;
  in1_06[0]._4_4_ = uVar36;
  in1_06[0]._0_4_ = uVar47;
  in1_06[1]._0_4_ = uVar48;
  in1_06[1]._4_4_ = uVar49;
  in1_06[2]._0_4_ = uVar50;
  in1_06[2]._4_4_ = uVar51;
  in1_06[3]._0_4_ = uVar52;
  in1_06[3]._4_4_ = size;
  addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  auVar17._8_8_ = uVar9;
  auVar17._0_8_ = uVar9;
  auVar17._16_8_ = uVar9;
  auVar17._24_8_ = uVar10;
  auVar16._16_8_ = uStack_3b0;
  auVar16._0_16_ = auVar1;
  auVar16._24_8_ = uStack_3a8;
  auVar3 = vpmulld_avx2(auVar17,auVar16);
  auVar15._8_8_ = uVar11;
  auVar15._0_8_ = uVar11;
  auVar15._16_8_ = uVar11;
  auVar15._24_8_ = uVar12;
  auVar14._16_8_ = uStack_3b0;
  auVar14._0_16_ = auVar1;
  auVar14._24_8_ = uStack_3a8;
  auVar4 = vpmulld_avx2(auVar15,auVar14);
  auVar2 = vpsubd_avx2(auVar4,auVar3);
  auVar27._16_8_ = uStack_270;
  auVar27._0_16_ = auVar43;
  auVar27._24_8_ = uStack_268;
  auVar2 = vpaddd_avx2(auVar2,auVar27);
  vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  auVar2 = vpaddd_avx2(auVar4,auVar3);
  auVar26._16_8_ = uStack_270;
  auVar26._0_16_ = auVar43;
  auVar26._24_8_ = uStack_268;
  auVar2 = vpaddd_avx2(auVar2,auVar26);
  vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  in0_07[0]._4_4_ = uVar38;
  in0_07[0]._0_4_ = uVar37;
  in0_07[1] = in_stack_ffffffffffffe820;
  in0_07[2] = in_stack_ffffffffffffe828;
  in0_07[3] = in_stack_ffffffffffffe830;
  in1_07[0]._4_4_ = uVar36;
  in1_07[0]._0_4_ = uVar47;
  in1_07[1]._0_4_ = uVar48;
  in1_07[1]._4_4_ = uVar49;
  in1_07[2]._0_4_ = uVar50;
  in1_07[2]._4_4_ = uVar51;
  in1_07[3]._0_4_ = uVar52;
  in1_07[3]._4_4_ = size;
  addsub_avx2(in0_07,in1_07,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_08[0]._4_4_ = uVar38;
  in0_08[0]._0_4_ = uVar37;
  in0_08[1] = in_stack_ffffffffffffe820;
  in0_08[2] = in_stack_ffffffffffffe828;
  in0_08[3] = in_stack_ffffffffffffe830;
  in1_08[0]._4_4_ = uVar36;
  in1_08[0]._0_4_ = uVar47;
  in1_08[1]._0_4_ = uVar48;
  in1_08[1]._4_4_ = uVar49;
  in1_08[2]._0_4_ = uVar50;
  in1_08[2]._4_4_ = uVar51;
  in1_08[3]._0_4_ = uVar52;
  in1_08[3]._4_4_ = size;
  addsub_avx2(in0_08,in1_08,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_09[0]._4_4_ = uVar38;
  in0_09[0]._0_4_ = uVar37;
  in0_09[1] = in_stack_ffffffffffffe820;
  in0_09[2] = in_stack_ffffffffffffe828;
  in0_09[3] = in_stack_ffffffffffffe830;
  in1_09[0]._4_4_ = uVar36;
  in1_09[0]._0_4_ = uVar47;
  in1_09[1]._0_4_ = uVar48;
  in1_09[1]._4_4_ = uVar49;
  in1_09[2]._0_4_ = uVar50;
  in1_09[2]._4_4_ = uVar51;
  in1_09[3]._0_4_ = uVar52;
  in1_09[3]._4_4_ = size;
  addsub_avx2(in0_09,in1_09,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_10[0]._4_4_ = uVar38;
  in0_10[0]._0_4_ = uVar37;
  in0_10[1] = in_stack_ffffffffffffe820;
  in0_10[2] = in_stack_ffffffffffffe828;
  in0_10[3] = in_stack_ffffffffffffe830;
  in1_10[0]._4_4_ = uVar36;
  in1_10[0]._0_4_ = uVar47;
  in1_10[1]._0_4_ = uVar48;
  in1_10[1]._4_4_ = uVar49;
  in1_10[2]._0_4_ = uVar50;
  in1_10[2]._4_4_ = uVar51;
  in1_10[3]._0_4_ = uVar52;
  in1_10[3]._4_4_ = size;
  addsub_avx2(in0_10,in1_10,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_11[0]._4_4_ = uVar38;
  in0_11[0]._0_4_ = uVar37;
  in0_11[1] = in_stack_ffffffffffffe820;
  in0_11[2] = in_stack_ffffffffffffe828;
  in0_11[3] = in_stack_ffffffffffffe830;
  in1_11[0]._4_4_ = uVar36;
  in1_11[0]._0_4_ = uVar47;
  in1_11[1]._0_4_ = uVar48;
  in1_11[1]._4_4_ = uVar49;
  in1_11[2]._0_4_ = uVar50;
  in1_11[2]._4_4_ = uVar51;
  in1_11[3]._0_4_ = uVar52;
  in1_11[3]._4_4_ = size;
  addsub_avx2(in0_11,in1_11,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_12[0]._4_4_ = uVar38;
  in0_12[0]._0_4_ = uVar37;
  in0_12[1] = in_stack_ffffffffffffe820;
  in0_12[2] = in_stack_ffffffffffffe828;
  in0_12[3] = in_stack_ffffffffffffe830;
  in1_12[0]._4_4_ = uVar36;
  in1_12[0]._0_4_ = uVar47;
  in1_12[1]._0_4_ = uVar48;
  in1_12[1]._4_4_ = uVar49;
  in1_12[2]._0_4_ = uVar50;
  in1_12[2]._4_4_ = uVar51;
  in1_12[3]._0_4_ = uVar52;
  in1_12[3]._4_4_ = size;
  addsub_avx2(in0_12,in1_12,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_13[0]._4_4_ = uVar38;
  in0_13[0]._0_4_ = uVar37;
  in0_13[1] = in_stack_ffffffffffffe820;
  in0_13[2] = in_stack_ffffffffffffe828;
  in0_13[3] = in_stack_ffffffffffffe830;
  in1_13[0]._4_4_ = uVar36;
  in1_13[0]._0_4_ = uVar47;
  in1_13[1]._0_4_ = uVar48;
  in1_13[1]._4_4_ = uVar49;
  in1_13[2]._0_4_ = uVar50;
  in1_13[2]._4_4_ = uVar51;
  in1_13[3]._0_4_ = uVar52;
  in1_13[3]._4_4_ = size;
  addsub_avx2(in0_13,in1_13,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_14[0]._4_4_ = uVar38;
  in0_14[0]._0_4_ = uVar37;
  in0_14[1] = in_stack_ffffffffffffe820;
  in0_14[2] = in_stack_ffffffffffffe828;
  in0_14[3] = in_stack_ffffffffffffe830;
  in1_14[0]._4_4_ = uVar36;
  in1_14[0]._0_4_ = uVar47;
  in1_14[1]._0_4_ = uVar48;
  in1_14[1]._4_4_ = uVar49;
  in1_14[2]._0_4_ = uVar50;
  in1_14[2]._4_4_ = uVar51;
  in1_14[3]._0_4_ = uVar52;
  in1_14[3]._4_4_ = size;
  addsub_avx2(in0_14,in1_14,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  auVar13._16_8_ = uStack_3b0;
  auVar13._0_16_ = auVar1;
  auVar13._24_8_ = uStack_3a8;
  auVar3 = vpmulld_avx2(auVar22,auVar13);
  auVar4._16_8_ = uStack_3b0;
  auVar4._0_16_ = auVar1;
  auVar4._24_8_ = uStack_3a8;
  auVar4 = vpmulld_avx2(auVar23,auVar4);
  auVar2 = vpsubd_avx2(auVar4,auVar3);
  auVar25._16_8_ = uStack_270;
  auVar25._0_16_ = auVar43;
  auVar25._24_8_ = uStack_268;
  auVar2 = vpaddd_avx2(auVar2,auVar25);
  vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  auVar2 = vpaddd_avx2(auVar3,auVar4);
  auVar24._16_8_ = uStack_270;
  auVar24._0_16_ = auVar43;
  auVar24._24_8_ = uStack_268;
  auVar2 = vpaddd_avx2(auVar2,auVar24);
  vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  auVar3._16_8_ = uStack_3b0;
  auVar3._0_16_ = auVar1;
  auVar3._24_8_ = uStack_3a8;
  auVar3 = vpmulld_avx2(auVar30,auVar3);
  auVar2._16_8_ = uStack_3b0;
  auVar2._0_16_ = auVar1;
  auVar2._24_8_ = uStack_3a8;
  auVar4 = vpmulld_avx2(auVar31,auVar2);
  auVar2 = vpsubd_avx2(auVar4,auVar3);
  auVar23._16_8_ = uStack_270;
  auVar23._0_16_ = auVar43;
  auVar23._24_8_ = uStack_268;
  auVar2 = vpaddd_avx2(auVar2,auVar23);
  vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  auVar2 = vpaddd_avx2(auVar3,auVar4);
  auVar22._16_8_ = uStack_270;
  auVar22._0_16_ = auVar43;
  auVar22._24_8_ = uStack_268;
  auVar2 = vpaddd_avx2(auVar2,auVar22);
  vpsrad_avx2(auVar2,ZEXT416(in_EDX));
  in0_15[0]._4_4_ = uVar38;
  in0_15[0]._0_4_ = uVar37;
  in0_15[1] = in_stack_ffffffffffffe820;
  in0_15[2] = in_stack_ffffffffffffe828;
  in0_15[3] = in_stack_ffffffffffffe830;
  in1_15[0]._4_4_ = uVar36;
  in1_15[0]._0_4_ = uVar47;
  in1_15[1]._0_4_ = uVar48;
  in1_15[1]._4_4_ = uVar49;
  in1_15[2]._0_4_ = uVar50;
  in1_15[2]._4_4_ = uVar51;
  in1_15[3]._0_4_ = uVar52;
  in1_15[3]._4_4_ = size;
  addsub_avx2(in0_15,in1_15,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_16[0]._4_4_ = uVar38;
  in0_16[0]._0_4_ = uVar37;
  in0_16[1] = in_stack_ffffffffffffe820;
  in0_16[2] = in_stack_ffffffffffffe828;
  in0_16[3] = in_stack_ffffffffffffe830;
  in1_16[0]._4_4_ = uVar36;
  in1_16[0]._0_4_ = uVar47;
  in1_16[1]._0_4_ = uVar48;
  in1_16[1]._4_4_ = uVar49;
  in1_16[2]._0_4_ = uVar50;
  in1_16[2]._4_4_ = uVar51;
  in1_16[3]._0_4_ = uVar52;
  in1_16[3]._4_4_ = size;
  addsub_avx2(in0_16,in1_16,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_17[0]._4_4_ = uVar38;
  in0_17[0]._0_4_ = uVar37;
  in0_17[1] = in_stack_ffffffffffffe820;
  in0_17[2] = in_stack_ffffffffffffe828;
  in0_17[3] = in_stack_ffffffffffffe830;
  in1_17[0]._4_4_ = uVar36;
  in1_17[0]._0_4_ = uVar47;
  in1_17[1]._0_4_ = uVar48;
  in1_17[1]._4_4_ = uVar49;
  in1_17[2]._0_4_ = uVar50;
  in1_17[2]._4_4_ = uVar51;
  in1_17[3]._0_4_ = uVar52;
  in1_17[3]._4_4_ = size;
  addsub_avx2(in0_17,in1_17,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_18[0]._4_4_ = uVar38;
  in0_18[0]._0_4_ = uVar37;
  in0_18[1] = in_stack_ffffffffffffe820;
  in0_18[2] = in_stack_ffffffffffffe828;
  in0_18[3] = in_stack_ffffffffffffe830;
  in1_18[0]._4_4_ = uVar36;
  in1_18[0]._0_4_ = uVar47;
  in1_18[1]._0_4_ = uVar48;
  in1_18[1]._4_4_ = uVar49;
  in1_18[2]._0_4_ = uVar50;
  in1_18[2]._4_4_ = uVar51;
  in1_18[3]._0_4_ = uVar52;
  in1_18[3]._4_4_ = size;
  addsub_avx2(in0_18,in1_18,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_19[0]._4_4_ = uVar38;
  in0_19[0]._0_4_ = uVar37;
  in0_19[1] = in_stack_ffffffffffffe820;
  in0_19[2] = in_stack_ffffffffffffe828;
  in0_19[3] = in_stack_ffffffffffffe830;
  in1_19[0]._4_4_ = uVar36;
  in1_19[0]._0_4_ = uVar47;
  in1_19[1]._0_4_ = uVar48;
  in1_19[1]._4_4_ = uVar49;
  in1_19[2]._0_4_ = uVar50;
  in1_19[2]._4_4_ = uVar51;
  in1_19[3]._0_4_ = uVar52;
  in1_19[3]._4_4_ = size;
  addsub_avx2(in0_19,in1_19,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_20[0]._4_4_ = uVar38;
  in0_20[0]._0_4_ = uVar37;
  in0_20[1] = in_stack_ffffffffffffe820;
  in0_20[2] = in_stack_ffffffffffffe828;
  in0_20[3] = in_stack_ffffffffffffe830;
  in1_20[0]._4_4_ = uVar36;
  in1_20[0]._0_4_ = uVar47;
  in1_20[1]._0_4_ = uVar48;
  in1_20[1]._4_4_ = uVar49;
  in1_20[2]._0_4_ = uVar50;
  in1_20[2]._4_4_ = uVar51;
  in1_20[3]._0_4_ = uVar52;
  in1_20[3]._4_4_ = size;
  addsub_avx2(in0_20,in1_20,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_21[0]._4_4_ = uVar38;
  in0_21[0]._0_4_ = uVar37;
  in0_21[1] = in_stack_ffffffffffffe820;
  in0_21[2] = in_stack_ffffffffffffe828;
  in0_21[3] = in_stack_ffffffffffffe830;
  in1_21[0]._4_4_ = uVar36;
  in1_21[0]._0_4_ = uVar47;
  in1_21[1]._0_4_ = uVar48;
  in1_21[1]._4_4_ = uVar49;
  in1_21[2]._0_4_ = uVar50;
  in1_21[2]._4_4_ = uVar51;
  in1_21[3]._0_4_ = uVar52;
  in1_21[3]._4_4_ = size;
  addsub_avx2(in0_21,in1_21,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  in0_22[0]._4_4_ = uVar38;
  in0_22[0]._0_4_ = uVar37;
  in0_22[1] = in_stack_ffffffffffffe820;
  in0_22[2] = in_stack_ffffffffffffe828;
  in0_22[3] = in_stack_ffffffffffffe830;
  in1_22[0]._4_4_ = uVar36;
  in1_22[0]._0_4_ = uVar47;
  in1_22[1]._0_4_ = uVar48;
  in1_22[1]._4_4_ = uVar49;
  in1_22[2]._0_4_ = uVar50;
  in1_22[2]._4_4_ = uVar51;
  in1_22[3]._0_4_ = uVar52;
  in1_22[3]._4_4_ = size;
  addsub_avx2(in0_22,in1_22,(__m256i *)CONCAT44(uVar35,uVar46),(__m256i *)CONCAT44(bit_00,uVar45),
              (__m256i *)CONCAT44(uVar42,uVar34),(__m256i *)CONCAT44(uVar32,uVar33));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_1850 = '\x10';
    }
    else {
      local_1850 = (char)in_R8D + '\x06';
    }
    uVar42 = -(1 << (local_1850 - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar42),uVar42,1);
    auVar1 = vpinsrd_avx(auVar1,uVar42,2);
    vpinsrd_avx(auVar1,uVar42,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar42),uVar42,1);
    auVar1 = vpinsrd_avx(auVar1,uVar42,2);
    vpinsrd_avx(auVar1,uVar42,3);
    uVar32 = (1 << (local_1850 - 1U & 0x1f)) - 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
    auVar1 = vpinsrd_avx(auVar1,uVar32,2);
    auVar1 = vpinsrd_avx(auVar1,uVar32,3);
    auVar44 = vpinsrd_avx(ZEXT416(uVar32),uVar32,1);
    auVar44 = vpinsrd_avx(auVar44,uVar32,2);
    auVar44 = vpinsrd_avx(auVar44,uVar32,3);
    auVar44 = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar44;
    palStack_170 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,0);
    round_shift_8x8_avx2((__m256i *)CONCAT44(uVar32,uVar42),in_stack_ffffffffffffe7a4);
    highbd_clamp_epi32_avx2
              (palStack_170,auVar44._8_8_,auVar44._0_8_,(__m256i *)CONCAT44(uVar38,uVar37),size);
  }
  return;
}

Assistant:

static void idct16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[0];
  x1[1] = input[8];
  x1[2] = input[4];
  x1[3] = input[12];
  x1[4] = input[2];
  x1[5] = input[10];
  x1[6] = input[6];
  x1[7] = input[14];
  x1[8] = input[1];
  x1[9] = input[9];
  x1[10] = input[5];
  x1[11] = input[13];
  x1[12] = input[3];
  x1[13] = input[11];
  x1[14] = input[7];
  x1[15] = input[15];

  // stage 2
  btf_16_w16_avx2(cospi_p60_m04, cospi_p04_p60, &x1[8], &x1[15], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p28_m36, cospi_p36_p28, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p44_m20, cospi_p20_p44, &x1[10], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p12_m52, cospi_p52_p12, &x1[11], &x1[12], _r,
                  INV_COS_BIT);

  // stage 3
  btf_16_w16_avx2(cospi_p56_m08, cospi_p08_p56, &x1[4], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p24_m40, cospi_p40_p24, &x1[5], &x1[6], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);

  // stage 4
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p48_m16, cospi_p16_p48, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r,
                  INV_COS_BIT);

  idct16_stage5_avx2(x1, cospi, _r, INV_COS_BIT);
  idct16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  idct16_stage7_avx2(output, x1);
}